

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

char * rtosc_match_path(char *pattern,char *msg,char **path_end)

{
  _Bool _Var1;
  char *pcVar2;
  char **in_RDX;
  char **in_RSI;
  char *in_RDI;
  bool bVar3;
  char *local_10;
  
  local_10 = in_RDI;
  if (in_RDX == (char **)0x0) {
    in_RDX = (char **)&stack0xffffffffffffffe8;
  }
  do {
    while( true ) {
      while( true ) {
        if ((*local_10 == ':') && (*(char *)in_RSI == '\0')) {
          *in_RDX = (char *)in_RSI;
          return local_10;
        }
        if (*local_10 != '{') break;
        local_10 = rtosc_match_options(local_10,(char **)&stack0xffffffffffffffe8);
        if (local_10 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      if (*local_10 != '*') break;
      while( true ) {
        bVar3 = false;
        if ((*local_10 != '\0') && (bVar3 = false, *local_10 != '/')) {
          bVar3 = *local_10 != ':';
        }
        if (!bVar3) break;
        local_10 = local_10 + 1;
      }
      if ((*local_10 == '/') || (*local_10 == ':')) {
        while( true ) {
          bVar3 = false;
          if (*(char *)in_RSI != '\0') {
            bVar3 = *(char *)in_RSI != '/';
          }
          if (!bVar3) break;
          in_RSI = (char **)((long)in_RSI + 1);
        }
      }
    }
    if ((*local_10 == '/') && (*(char *)in_RSI == '/')) {
      pcVar2 = local_10 + 1;
      in_RSI = (char **)((long)in_RSI + 1);
      if ((*pcVar2 == '\0') || (*pcVar2 == ':')) {
        *in_RDX = (char *)in_RSI;
        return pcVar2;
      }
    }
    else if (*local_10 == '#') {
      _Var1 = rtosc_match_number(in_RSI,in_RDX);
      if (!_Var1) {
        return (char *)0x0;
      }
    }
    else {
      if (*local_10 != *(char *)in_RSI) {
        return (char *)0x0;
      }
      if (*(char *)in_RSI == '\0') {
        *in_RDX = (char *)in_RSI;
        return local_10;
      }
      in_RSI = (char **)((long)in_RSI + 1);
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

const char *rtosc_match_path(const char *pattern,
                             const char *msg, const char** path_end)
{
    if(!path_end)
        path_end = &msg; // writing *path_end = msg later will have no effect
    while(1) {
        //Check for special characters
        if(*pattern == ':' && !*msg)
            return *path_end = msg, pattern;
        else if(*pattern == '{') {
            pattern = rtosc_match_options(pattern, &msg);
            if(!pattern)
                return NULL;
        } else if(*pattern == '*') {
            //advance message and pattern to '/' or ':' and '\0'
            while(*pattern && *pattern != '/' && *pattern != ':')
                pattern++;
            if(*pattern == '/' || *pattern == ':')
                while(*msg && *msg != '/')
                    msg++;
        } else if(*pattern == '/' && *msg == '/') {
            ++pattern;
            ++msg;
            if(*pattern == '\0' || *pattern == ':')
                return *path_end = msg, pattern;
        } else if(*pattern == '#') {
            ++pattern;
            if(!rtosc_match_number(&pattern, &msg))
                return NULL;
        } else if((*pattern == *msg)) { //verbatim compare
            if(*msg)
                ++pattern, ++msg;
            else
                return *path_end = msg, pattern;
        } else
            return NULL;
    }
}